

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O3

void __thiscall
Assimp::MD5Importer::AttachChilds_Anim
          (MD5Importer *this,int iParentID,aiNode *piParent,AnimBoneList *bones,
          aiNodeAnim **node_anims)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  aiNodeAnim *paVar5;
  aiVectorKey *paVar6;
  aiQuatKey *paVar7;
  int iVar8;
  pointer pAVar9;
  aiNode **ppaVar10;
  aiNode *this_00;
  pointer pAVar11;
  uint uVar12;
  aiNodeAnim **ppaVar13;
  ulong uVar14;
  long lVar15;
  char *__dest;
  ulong __n;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 local_430 [1024];
  
  if ((piParent == (aiNode *)0x0) || (piParent->mNumChildren != 0)) {
    __assert_fail("__null != piParent && !piParent->mNumChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD5/MD5Loader.cpp"
                  ,0x13e,
                  "void Assimp::MD5Importer::AttachChilds_Anim(int, aiNode *, AnimBoneList &, const aiNodeAnim **)"
                 );
  }
  pAVar9 = (bones->
           super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pAVar11 = (bones->
            super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)pAVar11 - (long)pAVar9) >> 4) * -0x3f03f03f < 1) {
    return;
  }
  uVar12 = 0;
  lVar15 = 0x404;
  uVar14 = 0;
  do {
    if (((uint)iParentID != uVar14) &&
       (*(int *)((long)(pAVar9->super_BaseJointDescription).mName.data +
                lVar15 + 0xfffffffffffffffcU) == iParentID)) {
      uVar12 = uVar12 + 1;
      piParent->mNumChildren = uVar12;
      pAVar9 = (bones->
               super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pAVar11 = (bones->
                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar14 = uVar14 + 1;
    lVar15 = lVar15 + 0x410;
  } while ((long)uVar14 < (long)((int)((ulong)((long)pAVar11 - (long)pAVar9) >> 4) * -0x3f03f03f));
  if (uVar12 != 0) {
    uVar14 = (ulong)uVar12;
    ppaVar10 = (aiNode **)operator_new__(uVar14 * 8);
    piParent->mChildren = ppaVar10;
    pAVar9 = (bones->
             super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pAVar11 = (bones->
              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)pAVar11 - (long)pAVar9) >> 4) * -0x3f03f03f) {
      uVar14 = 0;
      do {
        if ((uVar14 != (uint)iParentID) &&
           (pAVar9[uVar14].super_BaseJointDescription.mParentIndex == iParentID)) {
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          ppaVar10 = piParent->mChildren;
          piParent->mChildren = ppaVar10 + 1;
          *ppaVar10 = this_00;
          pAVar9 = (bones->
                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar14;
          uVar12 = (pAVar9->super_BaseJointDescription).mName.length;
          if (0x3fe < uVar12) {
            uVar12 = 0x3ff;
          }
          __n = (ulong)uVar12;
          memcpy(local_430,(pAVar9->super_BaseJointDescription).mName.data,__n);
          local_430[__n] = 0;
          (this_00->mName).length = uVar12;
          __dest = (this_00->mName).data;
          memcpy(__dest,local_430,__n);
          (this_00->mName).data[__n] = '\0';
          this_00->mParent = piParent;
          ppaVar13 = node_anims;
          while ((paVar5 = *ppaVar13, (paVar5->mNodeName).length != uVar12 ||
                 (iVar8 = bcmp((paVar5->mNodeName).data,__dest,__n), iVar8 != 0))) {
            ppaVar13 = ppaVar13 + 1;
          }
          paVar6 = paVar5->mPositionKeys;
          (this_00->mTransformation).a1 = 1.0;
          (this_00->mTransformation).a2 = 0.0;
          (this_00->mTransformation).a3 = 0.0;
          (this_00->mTransformation).a4 = 0.0;
          (this_00->mTransformation).b1 = 0.0;
          (this_00->mTransformation).b2 = 1.0;
          (this_00->mTransformation).b3 = 0.0;
          (this_00->mTransformation).b4 = 0.0;
          (this_00->mTransformation).c1 = 0.0;
          (this_00->mTransformation).c2 = 0.0;
          (this_00->mTransformation).c3 = 1.0;
          (this_00->mTransformation).c4 = 0.0;
          (this_00->mTransformation).d1 = 0.0;
          (this_00->mTransformation).d2 = 0.0;
          (this_00->mTransformation).d3 = 0.0;
          (this_00->mTransformation).d4 = 1.0;
          fVar21 = (paVar6->mValue).x;
          (this_00->mTransformation).a4 = fVar21;
          fVar1 = (paVar6->mValue).y;
          (this_00->mTransformation).b4 = fVar1;
          fVar2 = (paVar6->mValue).z;
          (this_00->mTransformation).c4 = fVar2;
          paVar7 = paVar5->mRotationKeys;
          fVar16 = (paVar7->mValue).z;
          fVar20 = (paVar7->mValue).w;
          uVar3 = (paVar7->mValue).x;
          uVar4 = (paVar7->mValue).y;
          fVar18 = (float)uVar4 * (float)uVar4 + fVar16 * fVar16;
          fVar25 = 1.0 - (fVar18 + fVar18);
          fVar19 = (float)uVar3 * fVar16 + (float)uVar4 * fVar20;
          fVar23 = (float)uVar3 * (float)uVar4 + fVar16 * fVar20;
          fVar18 = fVar16 * fVar16 + (float)uVar3 * (float)uVar3;
          fVar28 = 1.0 - (fVar18 + fVar18);
          fVar19 = fVar19 + fVar19;
          fVar23 = fVar23 + fVar23;
          fVar24 = (float)uVar4 * fVar16 - fVar20 * (float)uVar3;
          fVar24 = fVar24 + fVar24;
          fVar18 = fVar16 * (float)uVar3 + fVar20 * -(float)uVar4;
          fVar17 = fVar16 * (float)uVar4 + (float)uVar3 * fVar20;
          fVar18 = fVar18 + fVar18;
          fVar17 = fVar17 + fVar17;
          fVar31 = (float)uVar3 * (float)uVar3 + (float)uVar4 * (float)uVar4;
          fVar22 = 1.0 - (fVar31 + fVar31);
          fVar26 = fVar23 * 0.0;
          fVar27 = ((float)uVar3 * (float)uVar4 - fVar16 * fVar20) * 2.0;
          fVar29 = fVar28 * 0.0;
          fVar16 = fVar21 * 0.0;
          fVar30 = fVar24 * 0.0;
          fVar20 = fVar19 * 0.0;
          fVar31 = fVar20 + fVar30;
          (this_00->mTransformation).a1 = fVar16 + fVar25 + fVar26 + fVar18 * 0.0;
          (this_00->mTransformation).a2 = fVar16 + fVar29 + fVar27 + fVar17 * 0.0;
          (this_00->mTransformation).a3 = fVar19 + fVar30 + fVar22 * 0.0 + fVar16;
          (this_00->mTransformation).a4 = fVar21 + 0.0;
          fVar25 = fVar25 * 0.0;
          fVar27 = fVar27 * 0.0;
          fVar21 = fVar1 * 0.0;
          (this_00->mTransformation).b1 = fVar21 + fVar23 + fVar25 + fVar18 * 0.0;
          (this_00->mTransformation).b2 = fVar21 + fVar28 + fVar27 + fVar17 * 0.0;
          (this_00->mTransformation).b3 = fVar24 + fVar20 + fVar22 * 0.0 + fVar21;
          (this_00->mTransformation).b4 = fVar1 + 0.0;
          fVar21 = fVar2 * 0.0;
          fVar26 = fVar26 + fVar25;
          fVar29 = fVar29 + fVar27;
          (this_00->mTransformation).c1 = fVar21 + fVar18 + fVar26;
          (this_00->mTransformation).c2 = fVar21 + fVar17 + fVar29;
          (this_00->mTransformation).c3 = fVar22 + fVar31 + fVar21;
          (this_00->mTransformation).c4 = fVar2 + 0.0;
          (this_00->mTransformation).d1 = fVar18 * 0.0 + fVar26 + 0.0;
          (this_00->mTransformation).d2 = fVar17 * 0.0 + fVar29 + 0.0;
          (this_00->mTransformation).d3 = fVar22 * 0.0 + fVar31 + 0.0;
          (this_00->mTransformation).d4 = 1.0;
          AttachChilds_Anim(this,(int)uVar14,this_00,bones,node_anims);
          pAVar9 = (bones->
                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pAVar11 = (bones->
                    super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 <
               (long)((int)((ulong)((long)pAVar11 - (long)pAVar9) >> 4) * -0x3f03f03f));
      uVar14 = (ulong)piParent->mNumChildren;
      ppaVar10 = piParent->mChildren;
    }
    piParent->mChildren = ppaVar10 + -uVar14;
    return;
  }
  return;
}

Assistant:

void MD5Importer::AttachChilds_Anim(int iParentID,aiNode* piParent, AnimBoneList& bones,const aiNodeAnim** node_anims)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)
            {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the corresponding animation channel and its first frame
                const aiNodeAnim** cur = node_anims;
                while ((**cur).mNodeName != pc->mName)++cur;

                aiMatrix4x4::Translation((**cur).mPositionKeys[0].mValue,pc->mTransformation);
                pc->mTransformation = pc->mTransformation * aiMatrix4x4((**cur).mRotationKeys[0].mValue.GetMatrix()) ;

                // add children to this node, too
                AttachChilds_Anim( i, pc, bones,node_anims);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}